

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_walks.cpp
# Opt level: O2

size_t handlegraph::algorithms::count_walks(HandleGraph *graph)

{
  _Head_base<1UL,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_false>
  *this;
  mapped_type *pmVar1;
  size_t sVar2;
  ulong uVar3;
  handle_t *sink;
  pointer __k;
  HandleGraph *in_stack_ffffffffffffff78;
  tuple<std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
  to_receive;
  
  count_walks_through_nodes(in_stack_ffffffffffffff78);
  sVar2 = 0xffffffffffffffff;
  if (to_receive.
      super__Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
      .
      super__Tuple_impl<1UL,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
      .super__Tuple_impl<2UL,_bool>.super__Head_base<2UL,_bool,_false>._M_head_impl == false) {
    this = &to_receive.
            super__Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
            .
            super__Tuple_impl<1UL,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
            .
            super__Head_base<1UL,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_false>
    ;
    __k = to_receive.
          super__Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
          .
          super__Head_base<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_false>
          ._M_head_impl.
          super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl.
          super__Vector_impl_data._M_start;
    for (uVar3 = 0;
        (sVar2 = uVar3,
        __k != to_receive.
               super__Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
               .
               super__Head_base<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_false>
               ._M_head_impl.
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
               _M_impl.super__Vector_impl_data._M_finish &&
        (pmVar1 = std::__detail::
                  _Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,__k), sVar2 = 0xffffffffffffffff, !CARRY8(*pmVar1,uVar3)));
        uVar3 = uVar3 + *pmVar1) {
      pmVar1 = std::__detail::
               _Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<handlegraph::handle_t,_std::pair<const_handlegraph::handle_t,_unsigned_long>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<handlegraph::handle_t>,_std::hash<handlegraph::handle_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,__k);
      __k = __k + 1;
    }
  }
  std::
  _Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
  ::~_Tuple_impl(&to_receive.
                  super__Tuple_impl<0UL,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>,_std::unordered_map<handlegraph::handle_t,_unsigned_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_unsigned_long>_>_>,_bool>
                );
  return sVar2;
}

Assistant:

size_t count_walks(const HandleGraph* graph){
    
    tuple<vector<handle_t>, unordered_map<handle_t, size_t>, bool>  to_receive = count_walks_through_nodes(graph);
    
    vector<handle_t>& sinks = get<0>(to_receive);
    unordered_map<handle_t, size_t>& count = get<1>(to_receive);
    bool& overflowed = get<2>(to_receive);
    
    if (overflowed) {
        return numeric_limits<size_t>::max();
    }
    
    // total up the walks at the sinks
    size_t total_count = 0;
    for (handle_t& sink : sinks) {
        if (numeric_limits<size_t>::max() - total_count < count[sink]) {
            return numeric_limits<size_t>::max();
        }
        total_count += count[sink];
    }
    return total_count;
}